

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O2

int Gia_ManEvalWindowInc
              (Gia_Man_t *p,Vec_Int_t *vLeaves,Vec_Int_t *vNodes,Vec_Wec_t *vWin,Vec_Int_t *vTemp,
              int fUseTwo)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  if (vNodes->nSize == vWin->nSize) {
    Gia_ManUpdateMapping(p,vNodes,vWin);
    Gia_ManCollectTfo(p,vLeaves,vTemp);
    iVar5 = -1;
    for (lVar6 = 0; iVar2 = vTemp->nSize, lVar6 < iVar2 / 2; lVar6 = lVar6 + 1) {
      piVar1 = vTemp->pArray;
      iVar4 = piVar1[lVar6];
      piVar1[lVar6] = piVar1[iVar2 + iVar5];
      piVar1[vTemp->nSize + iVar5] = iVar4;
      iVar5 = iVar5 + -1;
    }
    iVar5 = 0;
    for (iVar4 = 0; iVar4 < iVar2; iVar4 = iVar4 + 1) {
      iVar2 = Vec_IntEntry(vTemp,iVar4);
      iVar3 = Gia_ObjIsLut(p,iVar2);
      if (iVar3 != 0) {
        iVar2 = Gia_ObjComputeEdgeDelay(p,iVar2,p->vEdgeDelay,p->vEdge1,p->vEdge2,fUseTwo);
        if (iVar5 <= iVar2) {
          iVar5 = iVar2;
        }
      }
      iVar2 = vTemp->nSize;
    }
    Gia_ManUpdateMapping(p,vNodes,vWin);
    return iVar5;
  }
  __assert_fail("Vec_IntSize(vNodes) == Vec_WecSize(vWin)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                ,0x26b,
                "int Gia_ManEvalWindowInc(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, int)"
               );
}

Assistant:

int Gia_ManEvalWindowInc( Gia_Man_t * p, Vec_Int_t * vLeaves, Vec_Int_t * vNodes, Vec_Wec_t * vWin, Vec_Int_t * vTemp, int fUseTwo )
{
    int i, iLut, Delay, DelayMax = 0;
    assert( Vec_IntSize(vNodes) == Vec_WecSize(vWin) );
    Gia_ManUpdateMapping( p, vNodes, vWin );
    Gia_ManCollectTfo( p, vLeaves, vTemp );
    Vec_IntReverseOrder( vTemp );
    Vec_IntForEachEntry( vTemp, iLut, i )
    {
        if ( !Gia_ObjIsLut(p, iLut) )
            continue;
        Delay = Gia_ObjComputeEdgeDelay( p, iLut, p->vEdgeDelay, p->vEdge1, p->vEdge2, fUseTwo );
        DelayMax = Abc_MaxInt( DelayMax, Delay );
    }
    Gia_ManUpdateMapping( p, vNodes, vWin );
    return DelayMax;
}